

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_node.cpp
# Opt level: O1

CommonTableExpressionMap * __thiscall
duckdb::CommonTableExpressionMap::Copy
          (CommonTableExpressionMap *__return_storage_ptr__,CommonTableExpressionMap *this)

{
  unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
  *this_00;
  CTEMaterialize CVar1;
  pointer pbVar2;
  pointer puVar3;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var4;
  CommonTableExpressionInfo *__ptr;
  CommonTableExpressionInfo *pCVar5;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var6;
  pointer pCVar7;
  pointer pPVar8;
  pointer pSVar9;
  default_delete<duckdb::CommonTableExpressionInfo> *this_01;
  pointer ppVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *al;
  pointer __x;
  pointer this_02;
  templated_unique_single_t kv_info;
  CommonTableExpressionInfo *local_60;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_58;
  InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
  *local_50;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  pointer local_40;
  pointer local_38;
  
  local_50 = &__return_storage_ptr__->map;
  CommonTableExpressionMap(__return_storage_ptr__);
  ppVar10 = (this->map).map.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->map).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar10 != local_40) {
    do {
      local_60 = (CommonTableExpressionInfo *)operator_new(0x40);
      *(undefined8 *)((long)local_60 + 0x30) = 0;
      *(undefined8 *)((long)local_60 + 0x38) = 0;
      *(undefined8 *)((long)local_60 + 0x20) = 0;
      *(undefined8 *)((long)local_60 + 0x28) = 0;
      *(undefined8 *)((long)local_60 + 0x10) = 0;
      *(undefined8 *)((long)local_60 + 0x18) = 0;
      *(undefined8 *)local_60 = 0;
      *(undefined8 *)((long)local_60 + 8) = 0;
      *(undefined1 *)((long)local_60 + 0x38) = 1;
      this_00 = &ppVar10->second;
      pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->(this_00);
      pbVar2 = (pCVar7->aliases).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__x = (pCVar7->aliases).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pbVar2; __x = __x + 1) {
        pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&local_60);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pCVar7,__x);
      }
      local_38 = ppVar10;
      pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->(this_00);
      puVar3 = (pCVar7->key_targets).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_02 = (pCVar7->key_targets).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar3;
          this_02 = this_02 + 1) {
        pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&local_60);
        pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_02);
        (*(pPVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pCVar7->key_targets,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_48);
        if (local_48._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->(this_00);
      pSVar9 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
               ::operator->(&pCVar7->query);
      (*(pSVar9->super_SQLStatement)._vptr_SQLStatement[3])(&local_58,pSVar9);
      _Var6._M_head_impl = local_58._M_head_impl;
      local_58._M_head_impl = (SelectStatement *)0x0;
      pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                             *)&local_60);
      ppVar10 = local_38;
      _Var4._M_head_impl =
           (pCVar7->query).
           super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
           .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
      (pCVar7->query).
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var6._M_head_impl;
      if (_Var4._M_head_impl != (SelectStatement *)0x0) {
        (**(code **)(*(long *)&(_Var4._M_head_impl)->super_SQLStatement + 8))();
      }
      if (local_58._M_head_impl != (SelectStatement *)0x0) {
        (*((local_58._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
      local_58._M_head_impl = (SelectStatement *)0x0;
      pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->(this_00);
      CVar1 = pCVar7->materialized;
      pCVar7 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                             *)&local_60);
      pCVar7->materialized = CVar1;
      this_01 = (default_delete<duckdb::CommonTableExpressionInfo> *)
                InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
                ::operator[](local_50,&ppVar10->first);
      pCVar5 = local_60;
      local_60 = (CommonTableExpressionInfo *)0x0;
      __ptr = *(CommonTableExpressionInfo **)this_01;
      *(CommonTableExpressionInfo **)this_01 = pCVar5;
      if (__ptr != (CommonTableExpressionInfo *)0x0) {
        ::std::default_delete<duckdb::CommonTableExpressionInfo>::operator()(this_01,__ptr);
      }
      if (local_60 != (CommonTableExpressionInfo *)0x0) {
        ::std::default_delete<duckdb::CommonTableExpressionInfo>::operator()
                  ((default_delete<duckdb::CommonTableExpressionInfo> *)&local_60,local_60);
      }
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != local_40);
  }
  return (CommonTableExpressionMap *)local_50;
}

Assistant:

CommonTableExpressionMap CommonTableExpressionMap::Copy() const {
	CommonTableExpressionMap res;
	for (auto &kv : this->map) {
		auto kv_info = make_uniq<CommonTableExpressionInfo>();
		for (auto &al : kv.second->aliases) {
			kv_info->aliases.push_back(al);
		}
		for (auto &al : kv.second->key_targets) {
			kv_info->key_targets.push_back(al->Copy());
		}
		kv_info->query = unique_ptr_cast<SQLStatement, SelectStatement>(kv.second->query->Copy());
		kv_info->materialized = kv.second->materialized;
		res.map[kv.first] = std::move(kv_info);
	}

	return res;
}